

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

Fraction __thiscall Matrix::GetOctahedralNorm(Matrix *this)

{
  const_reference this_00;
  Fraction *pFVar1;
  double __x;
  Fraction local_30;
  int local_28;
  int row;
  Fraction sum;
  int column;
  Matrix *this_local;
  Fraction result;
  
  unique0x100000e9 = this;
  Fraction::Fraction((Fraction *)&this_local,0);
  for (sum.numerator_ = 0; sum.numerator_ < this->m_; sum.numerator_ = sum.numerator_ + 1) {
    Fraction::Fraction((Fraction *)&stack0xffffffffffffffdc,0);
    for (local_28 = 0; local_28 < this->n_; local_28 = local_28 + 1) {
      this_00 = std::
                vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                ::operator[](&this->elements_,(long)local_28);
      std::vector<Fraction,_std::allocator<Fraction>_>::operator[](this_00,(long)sum.numerator_);
      fabs(__x);
      Fraction::operator+=((Fraction *)&stack0xffffffffffffffdc,&local_30);
    }
    pFVar1 = std::max<Fraction>((Fraction *)&this_local,(Fraction *)&stack0xffffffffffffffdc);
    this_local = *(Matrix **)pFVar1;
  }
  return (Fraction)this_local;
}

Assistant:

Fraction Matrix::GetOctahedralNorm() const {
    Fraction result = 0;
    for (int column = 0; column < m_; ++column) {
        Fraction sum = 0;
        for (int row = 0; row < n_; ++row) {
            sum += fabs(elements_[row][column]);
        }
        result = std::max(result, sum);
    }

    return result;
}